

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O0

double AccumulateSSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar1;
  int off2;
  int off1;
  double sum;
  int y;
  int x;
  int h1;
  int h0;
  int w1;
  int w0;
  int local_58;
  int local_54;
  double local_48;
  int local_3c;
  int local_38;
  
  local_54 = in_R8D;
  if (2 < in_R8D) {
    local_54 = 3;
  }
  local_58 = in_R9D;
  if (2 < in_R9D) {
    local_58 = 3;
  }
  local_48 = 0.0;
  for (local_3c = 0; local_3c < local_58; local_3c = local_3c + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI,in_ESI,in_RDX,in_ECX,local_38,local_3c,in_R8D,in_R9D);
      local_48 = dVar1 + local_48;
    }
  }
  for (; local_3c < in_R9D + -4; local_3c = local_3c + 1) {
    for (local_38 = 0; local_38 < local_54; local_38 = local_38 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI,in_ESI,in_RDX,in_ECX,local_38,local_3c,in_R8D,in_R9D);
      local_48 = dVar1 + local_48;
    }
    for (; local_38 < in_R8D + -4; local_38 = local_38 + 1) {
      dVar1 = (*VP8SSIMGet)(in_RDI + (local_38 + -3 + (local_3c + -3) * in_ESI),in_ESI,
                            in_RDX + (local_38 + -3 + (local_3c + -3) * in_ECX),in_ECX);
      local_48 = dVar1 + local_48;
    }
    for (; local_38 < in_R8D; local_38 = local_38 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI,in_ESI,in_RDX,in_ECX,local_38,local_3c,in_R8D,in_R9D);
      local_48 = dVar1 + local_48;
    }
  }
  for (; local_3c < in_R9D; local_3c = local_3c + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      dVar1 = (*VP8SSIMGetClipped)(in_RDI,in_ESI,in_RDX,in_ECX,local_38,local_3c,in_R8D,in_R9D);
      local_48 = dVar1 + local_48;
    }
  }
  return local_48;
}

Assistant:

static double AccumulateSSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  const int w0 = (w < VP8_SSIM_KERNEL) ? w : VP8_SSIM_KERNEL;
  const int w1 = w - VP8_SSIM_KERNEL - 1;
  const int h0 = (h < VP8_SSIM_KERNEL) ? h : VP8_SSIM_KERNEL;
  const int h1 = h - VP8_SSIM_KERNEL - 1;
  int x, y;
  double sum = 0.;
  for (y = 0; y < h0; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h1; ++y) {
    for (x = 0; x < w0; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
    for (; x < w1; ++x) {
      const int off1 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * src_stride;
      const int off2 = x - VP8_SSIM_KERNEL + (y - VP8_SSIM_KERNEL) * ref_stride;
      sum += VP8SSIMGet(src + off1, src_stride, ref + off2, ref_stride);
    }
    for (; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  for (; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      sum += VP8SSIMGetClipped(src, src_stride, ref, ref_stride, x, y, w, h);
    }
  }
  return sum;
}